

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportFileGenerator.cxx
# Opt level: O1

void __thiscall
cmExportFileGenerator::GenerateImportedFileChecksCode
          (cmExportFileGenerator *this,ostream *os,cmGeneratorTarget *target,
          ImportPropertyMap *properties,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *importedLocations,string *importedXcFrameworkLocation)

{
  ostream *poVar1;
  const_iterator cVar2;
  _Base_ptr p_Var3;
  _Rb_tree_header *p_Var4;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  string targetName;
  string local_a0;
  pointer local_80;
  string *local_78;
  string local_70;
  string local_50;
  
  cmGeneratorTarget::GetExportName_abi_cxx11_(&local_50,target);
  local_a0._M_string_length = (size_type)(this->Namespace)._M_dataplus._M_p;
  local_a0._M_dataplus._M_p = (pointer)(this->Namespace)._M_string_length;
  local_a0.field_2._M_allocated_capacity = 0;
  local_a0.field_2._8_8_ = local_50._M_string_length;
  local_80 = local_50._M_dataplus._M_p;
  views._M_len = 2;
  views._M_array = (iterator)&local_a0;
  local_78 = &local_50;
  cmCatViews(&local_70,views);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (os,"list(APPEND _cmake_import_check_targets ",0x28);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (os,local_70._M_dataplus._M_p,local_70._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," )\n",3);
  if (importedXcFrameworkLocation->_M_string_length != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              (os,"set(_cmake_import_check_xcframework_for_",0x28);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (os,local_70._M_dataplus._M_p,local_70._M_string_length);
    local_a0._M_dataplus._M_p._0_1_ = 0x20;
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)&local_a0,1);
    cmExportFileGeneratorEscape(&local_a0,importedXcFrameworkLocation);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar1,local_a0._M_dataplus._M_p,local_a0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,")\n",2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (os,"list(APPEND _cmake_import_check_files_for_",0x2a);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (os,local_70._M_dataplus._M_p,local_70._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  p_Var3 = (importedLocations->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var4 = &(importedLocations->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var3 != p_Var4) {
    do {
      cVar2 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::find(&properties->_M_t,(key_type *)(p_Var3 + 1));
      if ((_Rb_tree_header *)cVar2._M_node != &(properties->_M_t)._M_impl.super__Rb_tree_header) {
        cmExportFileGeneratorEscape(&local_a0,(string *)(cVar2._M_node + 2));
        poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                           (os,local_a0._M_dataplus._M_p,local_a0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
          operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
        }
      }
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
    } while ((_Rb_tree_header *)p_Var3 != p_Var4);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,")\n\n",3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmExportFileGenerator::GenerateImportedFileChecksCode(
  std::ostream& os, cmGeneratorTarget* target,
  ImportPropertyMap const& properties,
  const std::set<std::string>& importedLocations,
  const std::string& importedXcFrameworkLocation)
{
  // Construct the imported target name.
  std::string targetName = cmStrCat(this->Namespace, target->GetExportName());

  os << "list(APPEND _cmake_import_check_targets " << targetName << " )\n";
  if (!importedXcFrameworkLocation.empty()) {
    os << "set(_cmake_import_check_xcframework_for_" << targetName << ' '
       << cmExportFileGeneratorEscape(importedXcFrameworkLocation) << ")\n";
  }
  os << "list(APPEND _cmake_import_check_files_for_" << targetName << " ";

  for (std::string const& li : importedLocations) {
    auto pi = properties.find(li);
    if (pi != properties.end()) {
      os << cmExportFileGeneratorEscape(pi->second) << " ";
    }
  }

  os << ")\n\n";
}